

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O2

bool filter(Options *opts,
           unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu)

{
  long lVar1;
  ostream *poVar2;
  runtime_error *this;
  NOAALRITHeader NVar3;
  string local_1e0 [32];
  PrimaryHeader ph;
  stringstream ss;
  ostream local_198 [376];
  
  assembler::SessionPDU::getHeader<lrit::PrimaryHeader>
            (&ph,(spdu->_M_t).
                 super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                 .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  NVar3 = assembler::SessionPDU::getHeader<lrit::NOAALRITHeader>
                    ((spdu->_M_t).
                     super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                     .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  if (ph.fileType == '\0') {
    lVar1 = 0x90;
  }
  else if (ph.fileType == 0x82) {
    lVar1 = 0x93;
  }
  else if (ph.fileType == '\x02') {
    lVar1 = 0x94;
    if (NVar3.productID != 9) {
      lVar1 = (ulong)(NVar3.productID == 6) * 2 + 0x92;
    }
  }
  else {
    if (ph.fileType != '\x01') {
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_198,"Invalid file type: ");
      std::operator<<(poVar2,ph.fileType);
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::runtime_error::runtime_error(this,local_1e0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    lVar1 = 0x91;
  }
  return (bool)(*(byte *)((long)&(opts->nanomsg)._M_dataplus._M_p + lVar1) ^ 1);
}

Assistant:

bool filter(const Options& opts, std::unique_ptr<assembler::SessionPDU>& spdu) {
  // Per http://www.noaasis.noaa.gov/LRIT/pdf-files/LRIT_receiver-specs.pdf,
  // Table 4, every file has a NOAA LRIT header.
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  if (ph.fileType == 0) {
    return !opts.images;
  }
  if (ph.fileType == 1) {
    return !opts.messages;
  }
  if (ph.fileType == 2) {
    // This may be an EMWIN file.
    if (nlh.productID == 6 || nlh.productID == 9) {
      return !opts.emwin;
    }
    return !opts.text;
  }
  if (ph.fileType == 130) {
    return !opts.dcs;
  }

  std::stringstream ss;
  ss << "Invalid file type: " << ph.fileType;
  throw std::runtime_error(ss.str());
}